

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

void __thiscall features::Surf::descriptor_assignment(Surf *this)

{
  bool bVar1;
  size_type __n;
  Keypoint *pKVar2;
  undefined1 local_130 [4];
  int sample;
  Descriptor descr;
  Keypoint *kp;
  size_t i;
  Surf *this_local;
  
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::clear
            (&this->descriptors);
  __n = std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::size
                  (&this->keypoints);
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::reserve
            (&this->descriptors,__n);
  for (kp = (Keypoint *)0x0;
      pKVar2 = (Keypoint *)
               std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::
               size(&this->keypoints), kp < pKVar2; kp = (Keypoint *)((long)&kp->octave + 1)) {
    descr.data.v._248_8_ =
         std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::
         operator[](&this->keypoints,(size_type)kp);
    Descriptor::Descriptor((Descriptor *)local_130);
    local_130 = *(undefined1 (*) [4])(descr.data.v._248_8_ + 8);
    sample = *(int *)(descr.data.v._248_8_ + 0xc);
    descr.x = ((float)(*(int *)((anonymous_namespace)::kernel_sizes +
                               (long)(int)(*(float *)(descr.data.v._248_8_ + 4) + 0.5) * 4 +
                               (long)*(int *)descr.data.v._248_8_ * 0x10) * 3) * 1.2) / 9.0;
    bVar1 = descriptor_orientation(this,(Descriptor *)local_130);
    if ((bVar1) &&
       (bVar1 = descriptor_computation
                          (this,(Descriptor *)local_130,
                           (bool)((this->options).use_upright_descriptor & 1)), bVar1)) {
      std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
      push_back(&this->descriptors,(value_type *)local_130);
    }
  }
  return;
}

Assistant:

void
Surf::descriptor_assignment (void)
{
    this->descriptors.clear();
    this->descriptors.reserve(keypoints.size());
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint const& kp = this->keypoints[i];

        /* Copy over the basic information to the descriptor. */
        Descriptor descr;
        descr.x = kp.x;
        descr.y = kp.y;

        /*
         * The scale is obtained from the filter size. The smallest filter in
         * SURF has size 9 and corresponds to a scale of 1.2. Thus, the
         * scale of a filter with size X has a scale of X * 1.2 / 9.
         */
        int sample = static_cast<int>(kp.sample + 0.5f);
        descr.scale = 3 * kernel_sizes[kp.octave][sample] * 1.2f / 9.0f;

        /* Find the orientation of the keypoint. */
        if (!this->descriptor_orientation(&descr))
            continue;

        /* Compute descriptor relative to orientation. */
        if (!this->descriptor_computation(&descr,
            this->options.use_upright_descriptor))
            continue;

        this->descriptors.push_back(descr);
    }
}